

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

Store * __thiscall
wasm::Builder::makeStore
          (Builder *this,uint bytes,Address offset,uint align,Expression *ptr,Expression *value,
          Type type,Name memory)

{
  ulong uVar1;
  Store *pSVar2;
  
  pSVar2 = (Store *)MixedArena::allocSpace((MixedArena *)(this->wasm + 0x158),0x58,8);
  *(undefined8 *)&(pSVar2->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression = 0;
  (pSVar2->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
  (pSVar2->align).addr = 0;
  *(undefined8 *)&pSVar2->isAtomic = 0;
  *(undefined8 *)&pSVar2->bytes = 0;
  (pSVar2->offset).addr = 0;
  (pSVar2->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
  pSVar2->isAtomic = false;
  pSVar2->bytes = (uint8_t)bytes;
  (pSVar2->offset).addr = offset.addr;
  (pSVar2->align).addr = (ulong)align;
  pSVar2->ptr = ptr;
  pSVar2->value = value;
  (pSVar2->valueType).id = type.id;
  (pSVar2->memory).super_IString.str._M_len = memory.super_IString.str._M_len;
  (pSVar2->memory).super_IString.str._M_str = memory.super_IString.str._M_str;
  wasm::Store::finalize();
  uVar1 = (pSVar2->value->type).id;
  if (uVar1 == type.id || uVar1 < 2) {
    return pSVar2;
  }
  __assert_fail("ret->value->type.isConcrete() ? ret->value->type == type : true",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-builder.h"
                ,0x1b8,
                "Store *wasm::Builder::makeStore(unsigned int, Address, unsigned int, Expression *, Expression *, Type, Name)"
               );
}

Assistant:

Store* makeStore(unsigned bytes,
                   Address offset,
                   unsigned align,
                   Expression* ptr,
                   Expression* value,
                   Type type,
                   Name memory) {
    auto* ret = wasm.allocator.alloc<Store>();
    ret->isAtomic = false;
    ret->bytes = bytes;
    ret->offset = offset;
    ret->align = align;
    ret->ptr = ptr;
    ret->value = value;
    ret->valueType = type;
    ret->memory = memory;
    ret->finalize();
    assert(ret->value->type.isConcrete() ? ret->value->type == type : true);
    return ret;
  }